

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfNoLock(MapFieldBase *this)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  Rep *pRVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  
  pRVar1 = this->repeated_field_;
  if (pRVar1 == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    return 0;
  }
  sVar4 = (long)(pRVar1->super_RepeatedPtrFieldBase).total_size_ << 3;
  pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 != (Rep *)0x0) {
    for (lVar5 = 0; lVar5 < pRVar2->allocated_size; lVar5 = lVar5 + 1) {
      lVar3 = (**(code **)(*pRVar2->elements[lVar5] + 0x98))();
      sVar4 = sVar4 + lVar3;
      pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
    }
    sVar4 = sVar4 + 8;
  }
  return sVar4;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfNoLock() const {
  if (repeated_field_ != NULL) {
    return repeated_field_->SpaceUsedExcludingSelfLong();
  } else {
    return 0;
  }
}